

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ios_prop.h
# Opt level: O2

void booster::locale::impl::ios_prop<booster::locale::ios_info>::set(ios_info *prop,ios_base *ios)

{
  int __ix;
  void **ppvVar1;
  ios_info *piVar2;
  
  __ix = get_id();
  ppvVar1 = std::ios_base::pword(ios,__ix);
  if (*ppvVar1 == (void *)0x0) {
    piVar2 = (ios_info *)operator_new(0x50);
    ios_info::ios_info(piVar2,prop);
    ppvVar1 = std::ios_base::pword(ios,__ix);
    *ppvVar1 = piVar2;
    std::ios_base::register_callback((_func_void_event_ios_base_ptr_int *)ios,0x18181a);
    return;
  }
  ppvVar1 = std::ios_base::pword(ios,__ix);
  if (*ppvVar1 != (void *)0xffffffffffffffff) {
    ppvVar1 = std::ios_base::pword(ios,__ix);
    ios_info::operator=((ios_info *)*ppvVar1,prop);
    return;
  }
  piVar2 = (ios_info *)operator_new(0x50);
  ios_info::ios_info(piVar2,prop);
  ppvVar1 = std::ios_base::pword(ios,__ix);
  *ppvVar1 = piVar2;
  return;
}

Assistant:

static void set(Property const &prop,std::ios_base &ios)
                {
                    int id=get_id();
                    if(ios.pword(id)==0) {
                        ios.pword(id) = new Property(prop);
                        ios.register_callback(callback,id);
                    }
                    else if(ios.pword(id)==invalid) {
                        ios.pword(id) = new Property(prop);
                    }
                    else {
                        *static_cast<Property *>(ios.pword(id))=prop;
                    }
                }